

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::AddStripRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  TargetType TVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  Indent IVar6;
  string stripArgs;
  string local_70;
  string local_50;
  
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if ((TVar3 != STATIC_LIBRARY) && (this->ImportLibrary == false)) {
    pcVar1 = this->Target->Target->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"APPLE","");
    bVar2 = cmMakefile::IsOn(pcVar1,&local_70);
    if (bVar2) {
      this_00 = this->Target;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MACOSX_BUNDLE","");
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2 == false) {
      pcVar1 = this->Target->Target->Makefile;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_STRIP","");
      bVar2 = cmMakefile::IsSet(pcVar1,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if (bVar2) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        pcVar1 = this->Target->Target->Makefile;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"APPLE","");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          TVar3 = cmGeneratorTarget::GetType(this->Target);
          if ((TVar3 == SHARED_LIBRARY) ||
             (TVar3 = cmGeneratorTarget::GetType(this->Target), TVar3 == MODULE_LIBRARY)) {
            std::__cxx11::string::_M_replace
                      ((ulong)&local_70,0,(char *)local_70._M_string_length,0x48e2bf);
          }
          else {
            TVar3 = cmGeneratorTarget::GetType(this->Target);
            if (TVar3 == EXECUTABLE) {
              std::__cxx11::string::operator=((string *)&local_70,"-u -r ");
            }
          }
        }
        IVar6.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar6.Level = IVar6.Level + -1;
          } while (IVar6.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"if(CMAKE_INSTALL_DO_STRIP)\n",0x1b);
        IVar6.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar6.Level = IVar6.Level + -1;
          } while (IVar6.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  execute_process(COMMAND \"",0x1b);
        pcVar1 = this->Target->Target->Makefile;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_STRIP","");
        __s = cmMakefile::GetDefinition(pcVar1,&local_50);
        if (__s == (char *)0x0) {
          std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
        }
        else {
          sVar4 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\" ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(toDestDirPath->_M_dataplus)._M_p,toDestDirPath->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddStripRule(std::ostream& os, Indent indent,
                                            const std::string& toDestDirPath)
{

  // don't strip static and import libraries, because it removes the only
  // symbol table they have so you can't link to them anymore
  if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
      this->ImportLibrary) {
    return;
  }

  // Don't handle OSX Bundles.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE") &&
      this->Target->GetPropertyAsBool("MACOSX_BUNDLE")) {
    return;
  }

  if (!this->Target->Target->GetMakefile()->IsSet("CMAKE_STRIP")) {
    return;
  }

  std::string stripArgs;

  // macOS 'strip' is picky, executables need '-u -r' and dylibs need '-x'.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE")) {
    if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
      stripArgs = "-x ";
    } else if (this->Target->GetType() == cmStateEnums::EXECUTABLE) {
      stripArgs = "-u -r ";
    }
  }

  os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n";
  os << indent << "  execute_process(COMMAND \""
     << this->Target->Target->GetMakefile()->GetDefinition("CMAKE_STRIP")
     << "\" " << stripArgs << "\"" << toDestDirPath << "\")\n";
  os << indent << "endif()\n";
}